

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value,CoordinateOrder *coordinateOrder,allocator_type *allocator
          )

{
  uchar *end_00;
  unsigned_long *begin_00;
  unsigned_long __n;
  uchar *data;
  ulong local_68;
  size_t j;
  size_t size;
  allocator<unsigned_char> local_39;
  allocator_type *local_38;
  allocator_type *allocator_local;
  CoordinateOrder *coordinateOrder_local;
  uchar *value_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> *this_local;
  
  local_38 = allocator;
  allocator_local = (allocator_type *)coordinateOrder;
  coordinateOrder_local = (CoordinateOrder *)value;
  value_local = (uchar *)end;
  end_local = begin;
  begin_local = (unsigned_long *)this;
  std::allocator<unsigned_char>::allocator(&local_39);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(this + 0x40),local_38);
  __n = std::accumulate<unsigned_long_const*,unsigned_long,std::multiplies<unsigned_long>>
                  (end_local,value_local,1);
  marray_detail::Assert<bool>(__n != 0);
  begin_00 = end_local;
  end_00 = value_local;
  data = __gnu_cxx::new_allocator<unsigned_char>::allocate
                   ((new_allocator<unsigned_char> *)(this + 0x40),__n,(void *)0x0);
  View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
            ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin_00,
             (unsigned_long *)end_00,data,(CoordinateOrder *)allocator_local,
             (CoordinateOrder *)allocator_local,local_38);
  for (local_68 = 0; local_68 < __n; local_68 = local_68 + 1) {
    *(char *)(*(long *)this + local_68) = (char)*coordinateOrder_local;
  }
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}